

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetProperty_Internal<true>
               (Var receiver,RecyclableObject *object,bool isRoot,PropertyId propertyId,Var newValue
               ,PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags)

{
  Type *typeWithoutProperty;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  undefined4 extraout_var;
  Type TVar9;
  ulong uVar10;
  BOOL local_4c;
  Var pvStack_48;
  BOOL setAccessorResult;
  PropertyValueInfo *local_40;
  uint local_34;
  
  if (receiver != (Var)0x0) {
    pvStack_48 = newValue;
    local_34 = propertyId;
    bVar3 = VarIs<Js::RecyclableObject>(receiver);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      local_40 = (PropertyValueInfo *)receiver;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xae1,"(!TaggedNumber::Is(receiver))",
                                  "!TaggedNumber::Is(receiver)");
      if (!bVar3) goto LAB_00ad0b6d;
      *puVar7 = 0;
      receiver = local_40;
    }
    local_4c = 0;
    bVar3 = SetAccessorOrNonWritableProperty
                      (receiver,object,local_34,pvStack_48,info,requestContext,
                       propertyOperationFlags,isRoot,false,&local_4c);
    if (bVar3) {
      return local_4c;
    }
    BVar5 = IsObject(receiver);
    if (BVar5 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      return 0;
    }
    typeWithoutProperty = (object->type).ptr;
    if (!isRoot) {
      pRVar8 = VarTo<Js::RecyclableObject>(receiver);
      if (((pRVar8->type).ptr)->typeId == TypeIds_Null) {
        return 0;
      }
      local_40 = info;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00ad0aa1:
      BVar5 = IsPropertyUnscopable(pRVar8,local_34);
      if (BVar5 != 0) {
        return 0;
      }
      iVar6 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x17])
                        (pRVar8,(ulong)local_34,pvStack_48,(ulong)propertyOperationFlags,local_40);
      if (iVar6 != 0) goto LAB_00ad0a14;
      pTVar1 = (pRVar8->type).ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
        if (pTVar1->typeId != TypeIds_Proxy) {
          iVar6 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[6])(pRVar8);
          pRVar8 = (RecyclableObject *)CONCAT44(extraout_var,iVar6);
          goto LAB_00ad0b57;
        }
        if ((pTVar1->prototype).ptr ==
            (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
              ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.
            ptr) goto LAB_00ad0b44;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x57a,
                                    "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                    ,
                                    "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                   );
        if (!bVar3) goto LAB_00ad0b6d;
        *puVar7 = 0;
      }
LAB_00ad0b44:
      pRVar8 = (pTVar1->prototype).ptr;
LAB_00ad0b57:
      if (((pRVar8->type).ptr)->typeId == TypeIds_Null) {
        return 0;
      }
      goto LAB_00ad0aa1;
    }
    uVar10 = (ulong)receiver & 0xffff000000000000;
    bVar3 = ((ulong)receiver & 0x1ffff00000000) != 0x1000000000000;
    local_40 = info;
    if (bVar3 && uVar10 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ad0b6d;
      *puVar7 = 0;
    }
    TVar9 = TypeIds_FirstNumberType;
    if ((uVar10 != 0x1000000000000) && (TVar9 = TypeIds_Number, (ulong)receiver >> 0x32 == 0)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(receiver);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00ad0b6d;
        *puVar7 = 0;
      }
      TVar9 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar9) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_00ad0b6d;
        *puVar7 = 0;
      }
    }
    if (TVar9 != TypeIds_GlobalObject) {
      if (bVar3 && uVar10 == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00ad0b6d;
        *puVar7 = 0;
      }
      TVar9 = TypeIds_FirstNumberType;
      if ((uVar10 != 0x1000000000000) && (TVar9 = TypeIds_Number, (ulong)receiver >> 0x32 == 0)) {
        pRVar8 = UnsafeVarTo<Js::RecyclableObject>(receiver);
        if (pRVar8 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00ad0b6d;
          *puVar7 = 0;
        }
        TVar9 = ((pRVar8->type).ptr)->typeId;
        if ((0x57 < (int)TVar9) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_00ad0b6d;
          *puVar7 = 0;
        }
      }
      if (TVar9 != TypeIds_LastTrueJavascriptObjectType) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xafa,
                                    "(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot)"
                                    ,"Root must be a global object!");
        if (!bVar3) {
LAB_00ad0b6d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    iVar6 = (*(code *)((PropertyValueInfo *)receiver)->m_instance[0x37].super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject)
                      (receiver,local_34,pvStack_48,propertyOperationFlags,local_40);
    if (iVar6 != 0) {
LAB_00ad0a14:
      bVar3 = VarIs<Js::JavascriptProxy>(receiver);
      if (!bVar3) {
        pRVar8 = VarTo<Js::RecyclableObject>(receiver);
        CacheOperators::CachePropertyWrite
                  (pRVar8,isRoot,typeWithoutProperty,local_34,local_40,requestContext);
        return 1;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetProperty_Internal(Var receiver, RecyclableObject* object, const bool isRoot, PropertyId propertyId, Var newValue, PropertyValueInfo * info, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags)
    {
        if (receiver == nullptr)
        {
            return FALSE;
        }

        Assert(!TaggedNumber::Is(receiver));
        BOOL setAccessorResult = FALSE;
        if (SetAccessorOrNonWritableProperty(receiver, object, propertyId, newValue, info, requestContext, propertyOperationFlags, isRoot, false, &setAccessorResult))
        {
            return setAccessorResult;
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
            return FALSE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Break on mutation if needed
        bool doNotUpdateCacheForMbp = MutationBreakpoint::IsFeatureEnabled(requestContext) ?
            MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue) : false;
#endif

        // Get the original type before setting the property
        Type *typeWithoutProperty = object->GetType();
        BOOL didSetProperty = false;
        if (isRoot)
        {
            AssertMsg(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject
                || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot,
                "Root must be a global object!");

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(receiver);
            didSetProperty = rootObject->SetRootProperty(propertyId, newValue, propertyOperationFlags, info);
        }
        else
        {
            RecyclableObject* instanceObject = VarTo<RecyclableObject>(receiver);
            while (!JavascriptOperators::IsNull(instanceObject))
            {
                if (unscopables && JavascriptOperators::IsPropertyUnscopable(instanceObject, propertyId))
                {
                    break;
                }
                else
                {
                    didSetProperty = instanceObject->SetProperty(propertyId, newValue, propertyOperationFlags, info);
                    if (didSetProperty || !unscopables)
                    {
                        break;
                    }
                }
                instanceObject = JavascriptOperators::GetPrototypeNoTrap(instanceObject);
            }
        }

        if (didSetProperty)
        {
            bool updateCache = true;
#ifdef ENABLE_MUTATION_BREAKPOINT
            updateCache = updateCache && !doNotUpdateCacheForMbp;
#endif

            if (updateCache)
            {
                if (!VarIs<JavascriptProxy>(receiver))
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, typeWithoutProperty, propertyId, info, requestContext);
                }
            }
            return TRUE;
        }

        return FALSE;
    }